

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

object * player_best_digger(player *p,_Bool forbid_stack)

{
  uint8_t uVar1;
  _Bool _Var2;
  wchar_t slot;
  object *poVar3;
  int local_17c;
  wchar_t old_number;
  wchar_t score;
  player_state_conflict local_state;
  wchar_t best_score;
  object *best;
  object *obj;
  object *current_weapon;
  wchar_t weapon_slot;
  _Bool forbid_stack_local;
  player *p_local;
  
  slot = slot_by_name(p,"weapon");
  poVar3 = slot_object(p,slot);
  stack0xffffffffffffffd0 = (object *)0x0;
  _Var2 = flag_has_dbg((p->state).pflags,10,0x13,"p->state.pflags","(PF_WOODEN)");
  if (_Var2) {
    local_17c = p->lev * 10;
  }
  else {
    local_17c = -1;
  }
  local_state.el_info[0x1a].flags = (undefined1)local_17c;
  local_state.el_info[0x1a]._3_1_ = local_17c._1_1_;
  local_state.el_info[0x1b].res_level = local_17c._2_2_;
  for (best = p->gear; best != (object *)0x0; best = best->next) {
    _Var2 = tval_is_melee_weapon(best);
    if ((((_Var2) && (best->number != '\0')) && ((!forbid_stack || (best->number < 2)))) &&
       (_Var2 = obj_can_takeoff(best), _Var2)) {
      uVar1 = best->number;
      if (best != poVar3) {
        best->number = '\x01';
        (p->body).slots[slot].obj = best;
      }
      local_state.stat_add[3] = 0;
      local_state.stat_ind[1] = 0;
      calc_bonuses(p,(player_state_conflict *)&old_number,true,false);
      if (best != poVar3) {
        best->number = uVar1;
        (p->body).slots[slot].obj = poVar3;
      }
      if ((int)local_state.el_info._106_4_ < local_state.skills[7]) {
        stack0xffffffffffffffd0 = best;
        local_state.el_info[0x1a].flags = (undefined1)local_state.skills[7];
        local_state.el_info[0x1a]._3_1_ = local_state.skills[7]._1_1_;
        local_state.el_info[0x1b].res_level = local_state.skills[7]._2_2_;
      }
    }
  }
  return stack0xffffffffffffffd0;
}

Assistant:

struct object *player_best_digger(struct player *p, bool forbid_stack)
{
	int weapon_slot = slot_by_name(p, "weapon");
	struct object *current_weapon = slot_object(p, weapon_slot);
	struct object *obj, *best = NULL;
	/*
	 * Prefer any melee weapon over unarmed digging, i.e. best == NULL,
	 * unless the player is an ent.
	 */
	int best_score = (player_has(p, PF_WOODEN)) ? p->lev * 10 : -1;
	struct player_state local_state;

	for (obj = p->gear; obj; obj = obj->next) {
		int score, old_number;
		if (!tval_is_melee_weapon(obj)) continue;
		if (obj->number < 1 || (forbid_stack && obj->number > 1)) continue;
		/* Don't use it if it has a sticky curse. */
		if (!obj_can_takeoff(obj)) continue;

		/* Swap temporarily for the calc_bonuses() computation. */
		old_number = obj->number;
		if (obj != current_weapon) {
			obj->number = 1;
			p->body.slots[weapon_slot].obj = obj;
		}

		/*
		 * Avoid side effects from using update set to false
		 * with calc_bonuses().
		 */
		local_state.stat_ind[STAT_STR] = 0;
		local_state.stat_ind[STAT_DEX] = 0;
		calc_bonuses(p, &local_state, true, false);
		score = local_state.skills[SKILL_DIGGING];

		/* Swap back. */
		if (obj != current_weapon) {
			obj->number = old_number;
			p->body.slots[weapon_slot].obj = current_weapon;
		}

		if (score > best_score) {
			best = obj;
			best_score = score;
		}
	}

	return best;
}